

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O0

void __thiscall adios2::profiling::Timer::AddToJsonStr(Timer *this,string *rankLog,bool addComma)

{
  ulong uVar1;
  byte in_DL;
  string *in_RSI;
  long in_RDI;
  char *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_128 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8 [32];
  string local_a8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [32];
  string local_38 [39];
  byte local_11;
  string *local_10;
  
  local_11 = in_DL & 1;
  if (*(long *)(in_RDI + 0x78) != 0) {
    local_10 = in_RSI;
    if (local_11 != 0) {
      std::__cxx11::string::operator+=(in_RSI,", ");
    }
    __lhs = &local_78;
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::operator+(__lhs,in_stack_fffffffffffffec0);
    std::__cxx11::to_string((long)in_stack_ffffffffffffff08);
    std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::__cxx11::string::operator+=(local_10,local_38);
    std::__cxx11::string::~string(local_38);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)&local_78);
    __rhs = &local_e8;
    std::__cxx11::to_string((unsigned_long)in_stack_fffffffffffffef8);
    std::operator+((char *)__lhs,__rhs);
    std::__cxx11::string::operator+=(local_10,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    if ((*(ulong *)(in_RDI + 0x78) < 500) && (uVar1 = std::__cxx11::string::size(), 2 < uVar1)) {
      std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      std::operator+(__lhs,(char *)__rhs);
      std::__cxx11::string::operator+=(local_10,(string *)&stack0xfffffffffffffef8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
      std::__cxx11::string::~string(local_128);
    }
    std::__cxx11::string::operator+=(local_10,"}");
  }
  return;
}

Assistant:

void AddToJsonStr(std::string &rankLog, const bool addComma = true) const
    {
        if (0 == m_nCalls)
            return;

        if (addComma)
        {
            rankLog += ", ";
        }
        rankLog += "\"" + m_Process + "\":{\"mus\":" + std::to_string(m_ProcessTime);
        rankLog += ", \"nCalls\":" + std::to_string(m_nCalls);

        if (500 > m_nCalls)
        {
            if (m_Details.size() > 2)
            {
                rankLog += ", \"trace\":[" + m_Details + "]";
            }
        }
        rankLog += "}";
    }